

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

bool __thiscall
p2t::Sweep::AngleExceedsPlus90DegreesOrIsNegative(Sweep *this,Point *origin,Point *pa,Point *pb)

{
  double dVar1;
  
  dVar1 = Angle(this,origin,pa,pb);
  return (bool)((-(dVar1 < 0.0) | -(1.5707963267948966 < dVar1)) & 1);
}

Assistant:

bool Sweep::AngleExceedsPlus90DegreesOrIsNegative(const Point* origin, const Point* pa, const Point* pb) const {
  const double angle = Angle(origin, pa, pb);
  return (angle > PI_div2) || (angle < 0);
}